

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::GRULayerParams::SharedDtor(GRULayerParams *this)

{
  GRULayerParams *pGVar1;
  GRULayerParams *this_local;
  
  pGVar1 = internal_default_instance();
  if ((this != pGVar1) && (this->updategateweightmatrix_ != (WeightParams *)0x0)) {
    (*(this->updategateweightmatrix_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pGVar1 = internal_default_instance();
  if ((this != pGVar1) && (this->resetgateweightmatrix_ != (WeightParams *)0x0)) {
    (*(this->resetgateweightmatrix_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pGVar1 = internal_default_instance();
  if ((this != pGVar1) && (this->outputgateweightmatrix_ != (WeightParams *)0x0)) {
    (*(this->outputgateweightmatrix_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pGVar1 = internal_default_instance();
  if ((this != pGVar1) && (this->updategaterecursionmatrix_ != (WeightParams *)0x0)) {
    (*(this->updategaterecursionmatrix_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pGVar1 = internal_default_instance();
  if ((this != pGVar1) && (this->resetgaterecursionmatrix_ != (WeightParams *)0x0)) {
    (*(this->resetgaterecursionmatrix_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pGVar1 = internal_default_instance();
  if ((this != pGVar1) && (this->outputgaterecursionmatrix_ != (WeightParams *)0x0)) {
    (*(this->outputgaterecursionmatrix_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pGVar1 = internal_default_instance();
  if ((this != pGVar1) && (this->updategatebiasvector_ != (WeightParams *)0x0)) {
    (*(this->updategatebiasvector_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pGVar1 = internal_default_instance();
  if ((this != pGVar1) && (this->resetgatebiasvector_ != (WeightParams *)0x0)) {
    (*(this->resetgatebiasvector_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pGVar1 = internal_default_instance();
  if ((this != pGVar1) && (this->outputgatebiasvector_ != (WeightParams *)0x0)) {
    (*(this->outputgatebiasvector_->super_MessageLite)._vptr_MessageLite[1])();
  }
  return;
}

Assistant:

void GRULayerParams::SharedDtor() {
  if (this != internal_default_instance()) {
    delete updategateweightmatrix_;
  }
  if (this != internal_default_instance()) {
    delete resetgateweightmatrix_;
  }
  if (this != internal_default_instance()) {
    delete outputgateweightmatrix_;
  }
  if (this != internal_default_instance()) {
    delete updategaterecursionmatrix_;
  }
  if (this != internal_default_instance()) {
    delete resetgaterecursionmatrix_;
  }
  if (this != internal_default_instance()) {
    delete outputgaterecursionmatrix_;
  }
  if (this != internal_default_instance()) {
    delete updategatebiasvector_;
  }
  if (this != internal_default_instance()) {
    delete resetgatebiasvector_;
  }
  if (this != internal_default_instance()) {
    delete outputgatebiasvector_;
  }
}